

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

int P_DetermineTranslucency(int lumpnum)

{
  undefined2 uVar1;
  uint uVar2;
  byte bVar3;
  BYTE index;
  char lumpname [9];
  FWadLump tranmap;
  byte local_62;
  char local_61 [8];
  undefined1 local_59;
  FWadLump local_58;
  
  FWadCollection::OpenLumpNum(&local_58,&Wads,lumpnum);
  FWadLump::Seek(&local_58,(ulong)(ushort)GPalette._1280_2_,0);
  FWadLump::Read(&local_58,&local_62,1);
  uVar1 = *(undefined2 *)((long)&GPalette.BaseColors[GPalette.Remap[local_62]].field_0 + 2);
  FWadLump::Seek(&local_58,(ulong)(ushort)(GPalette._1280_2_ << 8 | (ushort)GPalette._1280_2_ >> 8),
                 0);
  FWadLump::Read(&local_58,&local_62,1);
  bVar3 = (byte)uVar1;
  if ((~GPalette.BaseColors[GPalette.Remap[local_62]].field_0.d & 0xff0000) == 0) {
    if (2 < developer.Value) {
      local_59 = 0;
      FWadCollection::GetLumpName(&Wads,local_61,lumpnum);
      Printf("%s appears to be additive translucency %d (%d%%)\n",local_61,(ulong)bVar3,
             (ulong)((uint)bVar3 * 100) / 0xff);
    }
    uVar2 = -(uint)bVar3;
  }
  else {
    if (2 < developer.Value) {
      local_59 = 0;
      FWadCollection::GetLumpName(&Wads,local_61,lumpnum);
      Printf("%s appears to be translucency %d (%d%%)\n",local_61,(ulong)bVar3,
             (ulong)((uint)bVar3 * 100) / 0xff);
    }
    uVar2 = (uint)bVar3;
  }
  FWadLump::~FWadLump(&local_58);
  return uVar2;
}

Assistant:

int P_DetermineTranslucency (int lumpnum)
{
	FWadLump tranmap = Wads.OpenLumpNum (lumpnum);
	BYTE index;
	PalEntry newcolor;
	PalEntry newcolor2;

	tranmap.Seek (GPalette.BlackIndex * 256 + GPalette.WhiteIndex, SEEK_SET);
	tranmap.Read (&index, 1);

	newcolor = GPalette.BaseColors[GPalette.Remap[index]];

	tranmap.Seek (GPalette.WhiteIndex * 256 + GPalette.BlackIndex, SEEK_SET);
	tranmap.Read (&index, 1);
	newcolor2 = GPalette.BaseColors[GPalette.Remap[index]];
	if (newcolor2.r == 255)	// if black on white results in white it's either
							// fully transparent or additive
	{
		if (developer >= DMSG_NOTIFY)
		{
			char lumpname[9];
			lumpname[8] = 0;
			Wads.GetLumpName (lumpname, lumpnum);
			Printf ("%s appears to be additive translucency %d (%d%%)\n", lumpname, newcolor.r,
				newcolor.r*100/255);
		}
		return -newcolor.r;
	}

	if (developer >= DMSG_NOTIFY)
	{
		char lumpname[9];
		lumpname[8] = 0;
		Wads.GetLumpName (lumpname, lumpnum);
		Printf ("%s appears to be translucency %d (%d%%)\n", lumpname, newcolor.r,
			newcolor.r*100/255);
	}
	return newcolor.r;
}